

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

buffer_appender<char>
fmt::v7::detail::write_ptr<char,fmt::v7::detail::buffer_appender<char>,unsigned_long>
          (buffer_appender<char> out,unsigned_long value,basic_format_specs<char> *specs)

{
  byte bVar1;
  ulong uVar2;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> __result;
  long lVar3;
  char *pcVar4;
  unsigned_long uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  buffer<char> *buf;
  bool bVar10;
  undefined8 uStack_50;
  char local_48 [24];
  
  uVar5 = value;
  uVar9 = 2;
  do {
    uVar8 = uVar9;
    uVar9 = uVar8 + 1;
    bVar10 = 0xf < uVar5;
    uVar5 = uVar5 >> 4;
  } while (bVar10);
  if (specs == (basic_format_specs<char> *)0x0) {
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x18) <
        *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                 0x10) + uVar9) {
      uStack_50 = (code *)0x4e50e5;
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    }
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x18) <
        *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                 0x10) + 1U) {
      uStack_50 = (code *)0x4e50fa;
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    }
    lVar3 = *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 0x10);
    *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 0x10)
         = lVar3 + 1;
    *(undefined1 *)
     (*(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 8)
     + lVar3) = 0x30;
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x18) <
        *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                 0x10) + 1U) {
      uStack_50 = (code *)0x4e5123;
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    }
    lVar3 = *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 0x10);
    *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 0x10)
         = lVar3 + 1;
    *(undefined1 *)
     (*(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 8)
     + lVar3) = 0x78;
    lVar3 = *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                     + 0x10);
    uVar2 = (lVar3 + uVar9) - 2;
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x18) < uVar2) {
      lVar3 = 0;
    }
    else {
      *(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                0x10) = uVar2;
      lVar3 = lVar3 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>
                                      .container + 8);
    }
    if (lVar3 == 0) {
      pcVar4 = local_48 + (uVar8 - 2);
      do {
        *pcVar4 = "0123456789abcdef"[(uint)value & 0xf];
        pcVar4 = pcVar4 + -1;
        bVar10 = 0xf < value;
        value = value >> 4;
      } while (bVar10);
      uStack_50 = (code *)0x4e5277;
      out = std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                      (local_48,local_48 + (uVar8 - 1),out);
    }
    else {
      pcVar4 = (char *)(lVar3 + uVar9 + -3);
      do {
        *pcVar4 = "0123456789abcdef"[(uint)value & 0xf];
        pcVar4 = pcVar4 + -1;
        bVar10 = 0xf < value;
        value = value >> 4;
      } while (bVar10);
    }
  }
  else {
    uVar2 = (ulong)specs->width;
    if ((long)uVar2 < 0) {
      uStack_50 = format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  ::on_text;
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/core.h"
                  ,0x146,"negative value");
    }
    uVar7 = 0;
    if (uVar9 <= uVar2) {
      uVar7 = uVar2 - uVar9;
    }
    bVar1 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                     (ulong)((byte)specs->field_0x9 & 0xf));
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x18) <
        (specs->fill).size_ * uVar7 +
        *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                 0x10) + uVar9) {
      uStack_50 = (code *)0x4e5044;
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    }
    uVar2 = uVar7 >> (bVar1 & 0x3f);
    uStack_50 = (code *)0x4e505e;
    __result.container =
         (buffer<char> *)fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar2,&specs->fill);
    if (*(ulong *)((long)__result.container + 0x18) <
        *(long *)((long)__result.container + 0x10) + 1U) {
      uStack_50 = (code *)0x4e5076;
      (*(code *)**(undefined8 **)__result.container)(__result.container);
    }
    lVar3 = *(long *)((long)__result.container + 0x10);
    *(long *)((long)__result.container + 0x10) = lVar3 + 1;
    *(undefined1 *)(*(long *)((long)__result.container + 8) + lVar3) = 0x30;
    if (*(ulong *)((long)__result.container + 0x18) <
        *(long *)((long)__result.container + 0x10) + 1U) {
      uStack_50 = (code *)0x4e509f;
      (*(code *)**(undefined8 **)__result.container)(__result.container);
    }
    lVar3 = *(long *)((long)__result.container + 0x10);
    *(long *)((long)__result.container + 0x10) = lVar3 + 1;
    *(undefined1 *)(*(long *)((long)__result.container + 8) + lVar3) = 0x78;
    lVar3 = *(long *)((long)__result.container + 0x10);
    uVar6 = (lVar3 + uVar9) - 2;
    if (*(ulong *)((long)__result.container + 0x18) < uVar6) {
      lVar3 = 0;
    }
    else {
      *(ulong *)((long)__result.container + 0x10) = uVar6;
      lVar3 = lVar3 + *(long *)((long)__result.container + 8);
    }
    if (lVar3 == 0) {
      pcVar4 = local_48 + (uVar8 - 2);
      do {
        *pcVar4 = "0123456789abcdef"[(uint)value & 0xf];
        pcVar4 = pcVar4 + -1;
        bVar10 = 0xf < value;
        value = value >> 4;
      } while (bVar10);
      uStack_50 = (code *)0x4e51d1;
      __result.container =
           (buffer<char> *)
           std::__copy_move<false,false,std::random_access_iterator_tag>::
           __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                     (local_48,local_48 + (uVar8 - 1),(buffer_appender<char>)__result.container);
    }
    else {
      pcVar4 = (char *)(lVar3 + uVar9 + -3);
      do {
        *pcVar4 = "0123456789abcdef"[(uint)value & 0xf];
        pcVar4 = pcVar4 + -1;
        bVar10 = 0xf < value;
        value = value >> 4;
      } while (bVar10);
    }
    uStack_50 = (code *)0x4e51e5;
    out = fill<fmt::v7::detail::buffer_appender<char>,char>
                    ((buffer_appender<char>)__result.container,uVar7 - uVar2,&specs->fill);
  }
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

OutputIt write_ptr(OutputIt out, UIntPtr value,
                   const basic_format_specs<Char>* specs) {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  auto write = [=](iterator it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}